

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall
CVmObjTads::set_prop
          (CVmObjTads *this,CVmUndo *undo,vm_obj_id_t self,vm_prop_id_t prop,vm_val_t *val)

{
  byte bVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  CVmObjTads *pCVar4;
  vm_tadsobj_prop *pvVar5;
  vm_tadsobj_hdr *this_00;
  undefined6 in_register_0000000a;
  vm_val_t oldval;
  vm_val_t local_48;
  CVmObjTads *local_38;
  
  this_00 = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  local_38 = this;
  pvVar5 = vm_tadsobj_hdr::find_prop_entry(this_00,(uint)CONCAT62(in_register_0000000a,prop));
  pCVar4 = local_38;
  if (pvVar5 == (vm_tadsobj_prop *)0x0) {
    if (this_00->prop_entry_free == this_00->prop_entry_cnt) {
      this_00 = vm_tadsobj_hdr::expand(local_38,this_00);
      (pCVar4->super_CVmObject).ext_ = (char *)this_00;
    }
    pvVar5 = vm_tadsobj_hdr::alloc_prop_entry(this_00,prop,val,0);
    local_48.typ = VM_EMPTY;
    local_48.val.ptr = (void *)((ulong)(uint)local_48.val._4_4_ << 0x20);
  }
  else {
    local_48.typ = (pvVar5->val).typ;
    local_48._4_4_ = *(undefined4 *)&(pvVar5->val).field_0x4;
    local_48.val = (pvVar5->val).val;
    uVar3 = *(undefined4 *)&val->field_0x4;
    aVar2 = val->val;
    (pvVar5->val).typ = val->typ;
    *(undefined4 *)&(pvVar5->val).field_0x4 = uVar3;
    (pvVar5->val).val = aVar2;
  }
  if ((undo != (CVmUndo *)0x0) && ((pvVar5->flags & 2) == 0)) {
    CVmUndo::add_new_record_prop_key(undo,self,prop,&local_48);
    bVar1 = pvVar5->flags;
    pvVar5->flags = bVar1 | 2;
    if (((bVar1 & 1) == 0) && (local_48.typ != VM_EMPTY)) {
      local_48.typ = VM_EMPTY;
      local_48.val.obj = 1;
      CVmUndo::add_new_record_prop_key(undo,self,prop,&local_48);
    }
  }
  pvVar5->flags = pvVar5->flags | 1;
  mark_modified(local_38,undo,self);
  return;
}

Assistant:

void CVmObjTads::set_prop(VMG_ CVmUndo *undo, vm_obj_id_t self,
                          vm_prop_id_t prop, const vm_val_t *val)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* look for an existing property entry */
    vm_tadsobj_prop *entry = hdr->find_prop_entry(prop);

    /* check for an existing entry for the property */
    vm_val_t oldval;
    if (entry != 0)
    {
        /* found an existing entry - note the old value */
        oldval = entry->val;

        /* store the new value in the existing entry */
        entry->val = *val;
    }
    else
    {
        /* 
         *   We didn't find an existing entry for the property, so we have to
         *   add a new one.  If we don't have any free property slots left,
         *   expand the object to create some more property slots.  
         */
        if (!hdr->has_free_entries(1))
        {
            /* expand the extension to make room for more properties */
            ext_ = (char *)vm_tadsobj_hdr::expand(vmg_ this, hdr);

            /* get the reallocated header */
            hdr = get_hdr();
        }

        /* allocate a new entry */
        entry = hdr->alloc_prop_entry(prop, val, 0);

        /* 
         *   The old value didn't exist, so mark it emtpy, with an intval of
         *   zero.  The zero indicates that this is a newly created property
         *   entry, and thus should be deleted on undo.  
         */
        oldval.set_empty();
        oldval.val.intval = 0;
    }

    /*
     *   If we already have undo for this property for the current
     *   savepoint, as indicated by the undo flag for the property, we don't
     *   need to save undo for this change, since we already have an undo
     *   record in the current savepoint.  Otherwise, we need to add an undo
     *   record for this savepoint.  
     */
    if (undo != 0 && (entry->flags & VMTO_PROP_UNDO) == 0)
    {
        /* save the undo record */
        undo->add_new_record_prop_key(vmg_ self, prop, &oldval);

        /* mark the property as now having undo in this savepoint */
        entry->flags |= VMTO_PROP_UNDO;

        /* 
         *   If the entry wasn't previously marked as modified, remember this
         *   by storing an extra 'empty' undo record with intval 1 after the
         *   record we just saved.  When we see an 'empty' undo value with an
         *   intval of 1, we recognize it as this special marker that tells
         *   us to remove the 'modified' flag from the property.  Note that
         *   we don't need to bother if the old value was already empty,
         *   since that deletes the whole property on undo, making the
         *   'modified' flag irrelevant.  
         */
        if ((entry->flags & VMTO_PROP_MOD) == 0 && oldval.typ != VM_EMPTY)
        {
            /* store an empty undo record with intval 1 */
            oldval.set_empty();
            oldval.val.intval = 1;
            undo->add_new_record_prop_key(vmg_ self, prop, &oldval);
        }
    }

    /* mark the property entry as modified */
    entry->flags |= VMTO_PROP_MOD;

    /* mark the overall object as modified */
    mark_modified(vmg_ undo, self);
}